

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  void **ppvVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  QUEUE *q;
  QUEUE queue;
  long *local_38;
  void *local_30;
  
  ppvVar1 = loop->handle_queue;
  local_38 = (long *)loop->handle_queue[0];
  if (ppvVar1 != (void **)local_38) {
    local_30 = loop->handle_queue[1];
    *(long ***)local_30 = &local_38;
    plVar2 = (long *)local_38[1];
    loop->handle_queue[1] = plVar2;
    *plVar2 = (long)ppvVar1;
    local_38[1] = (long)&local_38;
    if (&local_38 != (long **)local_38) {
      do {
        lVar3 = *local_38;
        *(long *)local_38[1] = lVar3;
        *(long *)(lVar3 + 8) = local_38[1];
        *local_38 = (long)ppvVar1;
        puVar4 = (undefined8 *)loop->handle_queue[1];
        local_38[1] = (long)puVar4;
        *puVar4 = local_38;
        loop->handle_queue[1] = local_38;
        if ((*(byte *)(local_38 + 7) & 0x10) == 0) {
          (*walk_cb)((uv_handle_t *)(local_38 + -4),arg);
        }
      } while (&local_38 != (long **)local_38);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE queue;
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_MOVE(&loop->handle_queue, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->handle_queue, q);

    if (h->flags & UV_HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}